

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

cmLinkInterface * __thiscall
cmGeneratorTarget::GetLinkInterface
          (cmGeneratorTarget *this,string *config,cmGeneratorTarget *head,bool secondPass)

{
  _Base_ptr p_Var1;
  bool bVar2;
  TargetType TVar3;
  cmLinkInterface *pcVar4;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  *this_00;
  cmLinkInterface *pcVar5;
  cmGeneratorTarget *local_130;
  cmLinkInterface local_128;
  
  local_130 = head;
  bVar2 = cmTarget::IsImported(this->Target);
  if (bVar2) {
    pcVar4 = GetImportLinkInterface(this,config,head,Link,secondPass);
    return pcVar4;
  }
  TVar3 = cmTarget::GetType(this->Target);
  if ((TVar3 == EXECUTABLE) && (bVar2 = IsExecutableWithExports(this), !bVar2)) {
    return (cmLinkInterface *)0x0;
  }
  this_00 = &GetHeadToLinkInterfaceMap(this,config)->
             super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  ;
  if (((this_00->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (p_Var1 = (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
     *(char *)&p_Var1[4]._M_parent == '\0')) {
    local_130 = *(cmGeneratorTarget **)(p_Var1 + 1);
  }
  pcVar4 = &std::
            map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
            ::operator[](this_00,&local_130)->super_cmLinkInterface;
  if (secondPass) {
    memset(&local_128,0,0xf8);
    local_128.LanguageRuntimeLibraries._M_h._M_bucket_count = 1;
    local_128.LanguageRuntimeLibraries._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_128.LanguageRuntimeLibraries._M_h._M_element_count = 0;
    local_128.LanguageRuntimeLibraries._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_128.LanguageRuntimeLibraries._M_h._M_rehash_policy._M_next_resize = 0;
    local_128.LanguageRuntimeLibraries._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_128.SharedDeps.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.SharedDeps.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    local_128.SharedDeps.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    local_128.SharedDeps.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    local_128._204_8_ = 0;
    local_128.WrongConfigLibraries.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.WrongConfigLibraries.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_6_ = 0;
    local_128.WrongConfigLibraries.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
    _M_impl.super__Vector_impl_data._M_finish._6_2_ = 0;
    local_128.WrongConfigLibraries.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_6_ = 0;
    local_128._238_8_ = 0;
    local_128.LanguageRuntimeLibraries._M_h._M_buckets =
         &local_128.LanguageRuntimeLibraries._M_h._M_single_bucket;
    cmLinkInterface::operator=(pcVar4,&local_128);
    *(undefined4 *)&pcVar4->field_0xf2 = local_128._242_4_;
    std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector(&local_128.WrongConfigLibraries);
    std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector(&local_128.SharedDeps);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_128.LanguageRuntimeLibraries._M_h);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_128.Languages);
    std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
              (&local_128.super_cmLinkInterfaceLibraries.HeadExclude);
    std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
              (&local_128.super_cmLinkInterfaceLibraries.HeadInclude);
    std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
              (&local_128.super_cmLinkInterfaceLibraries.Objects);
    std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
              ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)&local_128);
  }
  if (pcVar4->field_0xf2 == '\0') {
    pcVar4->field_0xf2 = 1;
    ComputeLinkInterfaceLibraries(this,config,(cmOptionalLinkInterface *)pcVar4,local_130,Link);
  }
  if ((pcVar4->field_0xf3 == '\0') && (pcVar4->field_0xf3 = 1, pcVar4->field_0xf4 == '\x01')) {
    ComputeLinkInterface(this,config,(cmOptionalLinkInterface *)pcVar4,local_130,secondPass);
    ComputeLinkInterfaceRuntimeLibraries(this,config,(cmOptionalLinkInterface *)pcVar4);
  }
  pcVar5 = (cmLinkInterface *)0x0;
  if (pcVar4->field_0xf4 != '\0') {
    pcVar5 = pcVar4;
  }
  return pcVar5;
}

Assistant:

cmLinkInterface const* cmGeneratorTarget::GetLinkInterface(
  const std::string& config, cmGeneratorTarget const* head,
  bool secondPass) const
{
  // Imported targets have their own link interface.
  if (this->IsImported()) {
    return this->GetImportLinkInterface(config, head, LinkInterfaceFor::Link,
                                        secondPass);
  }

  // Link interfaces are not supported for executables that do not
  // export symbols.
  if (this->GetType() == cmStateEnums::EXECUTABLE &&
      !this->IsExecutableWithExports()) {
    return nullptr;
  }

  // Lookup any existing link interface for this configuration.
  cmHeadToLinkInterfaceMap& hm = this->GetHeadToLinkInterfaceMap(config);

  // If the link interface does not depend on the head target
  // then re-use the one from the head we computed first.
  if (!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition) {
    head = hm.begin()->first;
  }

  cmOptionalLinkInterface& iface = hm[head];
  if (secondPass) {
    iface = cmOptionalLinkInterface();
  }
  if (!iface.LibrariesDone) {
    iface.LibrariesDone = true;
    this->ComputeLinkInterfaceLibraries(config, iface, head,
                                        LinkInterfaceFor::Link);
  }
  if (!iface.AllDone) {
    iface.AllDone = true;
    if (iface.Exists) {
      this->ComputeLinkInterface(config, iface, head, secondPass);
      this->ComputeLinkInterfaceRuntimeLibraries(config, iface);
    }
  }

  return iface.Exists ? &iface : nullptr;
}